

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O1

IterateResult __thiscall VertexAttrib64Bit::GetVertexAttribTest::iterate(GetVertexAttribTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  GLuint index;
  bool result;
  bool local_19;
  
  iVar1 = (*((this->super_Base).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  memcpy(&(this->super_Base).gl,(void *)CONCAT44(extraout_var,iVar1),0x1a28);
  local_19 = true;
  Base::RequireExtension(&this->super_Base,"GL_ARB_vertex_attrib_64bit");
  initTest(this);
  if (1 < this->m_max_vertex_attribs) {
    index = 1;
    do {
      checkVertexAttribLd<1u>(this,index,&local_19);
      checkVertexAttribLd<2u>(this,index,&local_19);
      checkVertexAttribLd<3u>(this,index,&local_19);
      checkVertexAttribLd<4u>(this,index,&local_19);
      checkVertexAttribLdv<1u>(this,index,&local_19);
      checkVertexAttribLdv<2u>(this,index,&local_19);
      checkVertexAttribLdv<3u>(this,index,&local_19);
      checkVertexAttribLdv<4u>(this,index,&local_19);
      checkVertexAttribLPointer(this,index,&local_19);
      index = index + 1;
    } while ((int)index < this->m_max_vertex_attribs);
  }
  Base::IterateStop(&this->super_Base,local_19);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetVertexAttribTest::iterate()
{
	IterateStart();

	bool result = true;

	RequireExtension("GL_ARB_vertex_attrib_64bit");

	initTest();

	for (GLint i = 1; i < m_max_vertex_attribs; ++i)
	{
		checkVertexAttribLd<1>(i, result);
		checkVertexAttribLd<2>(i, result);
		checkVertexAttribLd<3>(i, result);
		checkVertexAttribLd<4>(i, result);
		checkVertexAttribLdv<1>(i, result);
		checkVertexAttribLdv<2>(i, result);
		checkVertexAttribLdv<3>(i, result);
		checkVertexAttribLdv<4>(i, result);
		checkVertexAttribLPointer(i, result);
	}

	/* Done */
	return IterateStop(result);
}